

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void summary(reg_object obj)

{
  double *pdVar1;
  ulong uVar2;
  
  putchar(10);
  printf("%-25s \n","Regression Summary");
  printf("%-25s%-20s%-20s \n","Coefficients","Value","Standard Error");
  pdVar1 = &obj->beta[0].stdErr;
  for (uVar2 = 0; (long)uVar2 < (long)obj->p; uVar2 = uVar2 + 1) {
    printf("B%-25d%-20lf%-20g \n",((bparam *)(pdVar1 + -3))->value,*pdVar1,uVar2 & 0xffffffff);
    pdVar1 = pdVar1 + 4;
  }
  putchar(10);
  printf("Residual Variance = %lf \n",obj->sigma);
  printf("R-Squared = %lf , Adjusted R-Squared = %lf \n",obj->R2[0],obj->R2[1]);
  return;
}

Assistant:

void summary(reg_object obj) {
	int i;
	printf("\n");
	printf("%-25s \n", "Regression Summary");
	printf("%-25s%-20s%-20s \n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("B%-25d%-20lf%-20g \n", i, (obj->beta + i)->value, (obj->beta + i)->stdErr);
	}
	printf("\n");
	printf("Residual Variance = %lf \n", obj->sigma);
	printf("R-Squared = %lf , Adjusted R-Squared = %lf \n", obj->R2[0], obj->R2[1]);

}